

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::GetPropertyFromDescriptor<true,int>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,Var originalInstance,
          DictionaryPropertyDescriptor<int> *descriptor,Var *value,PropertyValueInfo *info,
          int propertyT,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *pRVar7;
  byte bVar8;
  
  bVar8 = descriptor->Attributes;
  if (((bVar8 & 0x10) != 0) &&
     ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
      TypeIds_GlobalObject)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x202,"(!isLetConstGlobal || VarIs<RootObjectBase>(instance))",
                                "object must be a global object if letconstglobal is set");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    bVar8 = descriptor->Attributes;
  }
  BVar3 = 0;
  if ((bVar8 & 0x18) != 8) {
    iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>(descriptor);
    if (iVar4 == -1) {
      iVar4 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(descriptor);
      if (iVar4 == -1) {
        pRVar7 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(descriptor);
        if (info == (PropertyValueInfo *)0x0) {
          CacheOperators::CachePropertyReadForGetter
                    ((PropertyValueInfo *)0x0,originalInstance,propertyT,requestContext);
        }
        else {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
          CacheOperators::CachePropertyReadForGetter(info,originalInstance,propertyT,requestContext)
          ;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
        iVar4 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(descriptor);
        pvVar6 = DynamicObject::GetSlot(instance,iVar4);
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
        pRVar7 = (RecyclableObject *)
                 JavascriptOperators::CallGetter(pRVar7,originalInstance,requestContext);
      }
      *value = pRVar7;
    }
    else {
      pvVar6 = DynamicObject::GetSlot(instance,iVar4);
      *value = pvVar6;
      SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,iVar4,descriptor);
    }
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetPropertyFromDescriptor(DynamicObject* instance, Var originalInstance,
        DictionaryPropertyDescriptor<T>* descriptor, Var* value, PropertyValueInfo* info, PropertyType propertyT, ScriptContext* requestContext)
    {
        bool const isLetConstGlobal = (descriptor->Attributes & PropertyLetConstGlobal) != 0;
        AssertMsg(!isLetConstGlobal || VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
        if (allowLetConstGlobal)
        {
            // GetRootProperty: false if not global
            if (!(descriptor->Attributes & PropertyLetConstGlobal) && (descriptor->Attributes & PropertyDeleted))
            {
                return false;
            }
        }
        else
        {
            // GetProperty: don't count deleted or global.
            if (descriptor->Attributes & (PropertyDeleted | (descriptor->GetIsShadowed() ? 0 : PropertyLetConstGlobal)))
            {
                return false;
            }
        }

        T dataSlot = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlot != NoSlots)
        {
            *value = instance->GetSlot(dataSlot);
            SetPropertyValueInfo(info, instance, dataSlot, descriptor);
        }
        else if (descriptor->GetGetterPropertyIndex() != NoSlots)
        {
            // We must update cache before calling a getter, because it can invalidate something. Bug# 593815
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetGetterPropertyIndex(), descriptor->Attributes);
            CacheOperators::CachePropertyReadForGetter(info, originalInstance, propertyT, requestContext);
            PropertyValueInfo::SetNoCache(info, instance); // we already cached getter, so we don't have to do it once more

            RecyclableObject* func = UnsafeVarTo<RecyclableObject>(instance->GetSlot(descriptor->GetGetterPropertyIndex()));
            *value = JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            return true;
        }
        else
        {
            *value = instance->GetLibrary()->GetUndefined();
            return true;
        }
        return true;
    }